

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<char,unsigned_int,char*,fmt::v5::internal::no_thousands_sep>(void *out)

{
  char *pcVar1;
  size_t __n;
  char_type buffer [13];
  undefined1 local_25 [13];
  
  pcVar1 = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>(local_25);
  __n = (long)pcVar1 - (long)local_25;
  if (__n != 0) {
    memcpy(out,local_25,__n);
  }
  return (char *)((long)out + __n);
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}